

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpMap<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  undefined4 uVar4;
  uint uVar5;
  long lVar6;
  anon_class_24_3_6b4a22af f;
  anon_class_24_3_6b4a22af f_00;
  anon_class_24_3_6b4a22af f_01;
  anon_class_24_3_6b4a22af f_02;
  ErrnoSaver EVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  longdouble lVar13;
  char cVar14;
  uint uVar15;
  ParseContext *pPVar17;
  ulong uVar18;
  uint uVar16;
  ushort *puVar19;
  uint *puVar20;
  char *pcVar21;
  uint7 uVar24;
  Nonnull<const_char_*> pcVar22;
  ParseContext *pPVar23;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar25;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar26;
  int iVar27;
  undefined8 extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *pPVar28;
  ParseContext *extraout_RDX_01;
  undefined8 extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  ParseContext *extraout_RDX_04;
  MapFieldBaseForParse *target;
  ParseContext *this;
  int iVar29;
  ulong uVar30;
  long lVar31;
  ParseContext *ptr_00;
  ParseContext *msg_00;
  TcParseTableBase *table_00;
  FieldEntry *hasbits_00;
  long in_R10;
  ushort *p;
  uint uVar32;
  longdouble in_ST0;
  longdouble lVar33;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  pair<const_char_*,_int> pVar34;
  pair<const_char_*,_int> pVar35;
  FieldAux *aux;
  ParseContext *pPVar36;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_80;
  ParseContext *local_78;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Stack_70;
  ParseContext **local_68;
  ParseContext *local_60;
  ZeroCopyInputStream *local_58;
  FieldEntry *local_50;
  ParseContext *local_48;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *local_40;
  ParseContext *local_38;
  
  local_50 = (FieldEntry *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)local_50 & 3) != 0) {
    AlignFail(local_50);
  }
  local_80.data =
       (long)&table->has_bits_offset + (ulong)local_50->aux_idx * 8 + (ulong)table->aux_offset;
  bVar2 = *(byte *)(local_80.data + 4);
  if (((bVar2 & 1) == 0) || (uVar16 = data.field_0._0_4_, (uVar16 & 7) != 2)) {
    pcVar21 = MpFallback(msg,ptr,ctx,data,table,hasbits);
    return pcVar21;
  }
  uVar4 = *(undefined4 *)
           ((long)&table->has_bits_offset + (ulong)local_50->aux_idx * 8 + (ulong)table->aux_offset)
  ;
  this = (ParseContext *)((long)&msg->_vptr_MessageLite + (ulong)local_50->offset);
  if ((bVar2 & 2) == 0) {
    if (((ulong)this & 7) != 0) {
LAB_00441a24:
      AlignFail(this);
    }
    if (((ulong)(this->super_EpsCopyInputStream).limit_end_ & 1) != 0) {
      (*MapFieldBaseForParse::sync_map_with_repeated)(this,1);
    }
    this = (ParseContext *)&(this->super_EpsCopyInputStream).next_chunk_;
  }
  else if (((ulong)this & 7) != 0) goto LAB_00441a24;
  local_58 = (ZeroCopyInputStream *)(ulong)CONCAT14(bVar2,uVar4);
  do {
    pPVar28 = (ParseContext *)
              (ulong)*(ushort *)((long)&(this->super_EpsCopyInputStream).buffer_end_ + 4);
    pPVar17 = (ParseContext *)UntypedMapBase::AllocNode((UntypedMapBase *)this,(size_t)pPVar28);
    uVar18 = (ulong)*(ushort *)((long)&(this->super_EpsCopyInputStream).buffer_end_ + 4);
    uVar30 = uVar18 - 8;
    if (uVar30 < 8) {
      pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_long>
                          (uVar30,8,"node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)");
      pcVar21 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
      ;
      iVar27 = 0xb2c;
LAB_004419eb:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_78,pcVar21,iVar27,pcVar22);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_78);
    }
    (pPVar17->super_EpsCopyInputStream).buffer_end_ = (char *)0x0;
    pcVar21 = (pPVar17->super_EpsCopyInputStream).patch_buffer_ + (uVar18 - 0x30);
    pcVar21[0] = '\0';
    pcVar21[1] = '\0';
    pcVar21[2] = '\0';
    pcVar21[3] = '\0';
    pcVar21[4] = '\0';
    pcVar21[5] = '\0';
    pcVar21[6] = '\0';
    pcVar21[7] = '\0';
    f.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
           *)&local_48;
    f.this = (UntypedMapBase *)this;
    f.node = (NodeBase **)&local_60;
    local_78 = this;
    _Stack_70._M_head_impl = (LogMessageData *)&local_48;
    local_68 = &local_60;
    local_60 = pPVar17;
    local_48 = this;
    UntypedMapBase::
    VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
              ((UntypedMapBase *)this,f);
    local_40 = &local_80;
    f_00.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
              *)&local_48;
    f_00.this = (UntypedMapBase *)this;
    f_00.node = (NodeBase **)&local_60;
    local_78 = this;
    _Stack_70._M_head_impl = (LogMessageData *)&local_48;
    local_68 = &local_60;
    local_60 = pPVar17;
    local_48 = this;
    local_38 = this;
    UntypedMapBase::
    VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
              ((UntypedMapBase *)this,f_00);
    bVar3 = (byte)*(ushort *)ptr;
    aVar25.data._1_7_ = 0;
    aVar25.data._0_1_ = bVar3;
    if ((char)bVar3 < '\0') {
      pPVar28 = (ParseContext *)(ulong)(uint)bVar3;
      pVar34 = ReadSizeFallback(ptr,(uint)bVar3);
      pPVar23 = pVar34._8_8_;
      if (pVar34.first == (char *)0x0) goto LAB_004418e8;
      aVar25.data = (ulong)pPVar23 & 0xffffffff;
    }
    else {
      pVar34._8_8_ = extraout_RDX;
      pVar34.first = (char *)((long)ptr + 1);
    }
    pPVar23 = pVar34._8_8_;
    ptr_00 = (ParseContext *)pVar34.first;
    if (ctx->depth_ < 1) {
LAB_004418e8:
      lVar31._0_4_ = (this->super_EpsCopyInputStream).size_;
      lVar31._4_4_ = (this->super_EpsCopyInputStream).limit_;
      if (lVar31 == 0) {
        UntypedMapBase::DeleteNode((UntypedMapBase *)this,(NodeBase *)pPVar17);
        pPVar23 = extraout_RDX_01;
        pPVar28 = pPVar17;
      }
      pcVar21 = Error(msg,(char *)pPVar28,pPVar23,(TcFieldData)aVar25,table,hasbits);
      return pcVar21;
    }
    EpsCopyInputStream::PushLimit((EpsCopyInputStream *)&local_78,(char *)ctx,(int)pVar34.first);
    EVar7.saved_errno_ = local_78._0_4_;
    iVar27 = ctx->depth_;
    uVar30 = (long)iVar27 - 1;
    ctx->depth_ = (int)uVar30;
    aVar25 = local_80;
    msg_00 = pPVar17;
    table_00 = table;
    hasbits_00 = local_50;
    pPVar36 = this;
    puVar19 = (ushort *)
              ParseOneMapEntry((NodeBase *)pPVar17,(char *)ptr_00,ctx,(FieldAux *)local_80,table,
                               local_50,(UntypedMapBase *)this);
    iVar29 = ctx->depth_;
    if ((puVar19 != (ushort *)0x0) && ((int)uVar30 != iVar29)) {
      pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (uVar30,(long)iVar29,"old_depth == depth_");
      pcVar21 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
      ;
      iVar27 = 0x481;
      goto LAB_004419eb;
    }
    ctx->depth_ = iVar29 + 1;
    uVar32 = EVar7.saved_errno_ + (ctx->super_EpsCopyInputStream).limit_;
    (ctx->super_EpsCopyInputStream).limit_ = uVar32;
    pPVar23 = extraout_RDX_00;
    pPVar28 = ptr_00;
    if (((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) ||
       ((ctx->super_EpsCopyInputStream).limit_end_ =
             (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar32 >> 0x1f & uVar32),
       puVar19 == (ushort *)0x0)) goto LAB_004418e8;
    pPVar28 = extraout_RDX_00;
    if ((bVar2 & 0x10) == 0) {
LAB_0044177d:
      uVar32 = *(uint *)((long)&(this->super_EpsCopyInputStream).buffer_end_ + 4);
      if (5 < ((byte)(uVar32 >> 0x18) & 0xf)) {
switchD_004417a2_caseD_3:
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0xb68);
      }
      uVar15 = uVar32 >> 0x18 & 0xf;
      puVar20 = &switchD_004417a2::switchdataD_006cb484;
      uVar32 = (&switchD_004417a2::switchdataD_006cb484)[uVar15];
      pcVar21 = (char *)((long)&switchD_004417a2::switchdataD_006cb484 + (long)(int)uVar32);
      pPVar23 = ptr_00;
      lVar33 = in_ST0;
      lVar8 = in_ST1;
      lVar9 = in_ST2;
      lVar10 = in_ST3;
      lVar11 = in_ST4;
      lVar12 = in_ST5;
      lVar13 = in_ST6;
      switch(uVar15) {
      case 0:
        KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)this,(KeyNode *)pPVar17);
        break;
      case 1:
        KeyMapBase<unsigned_int>::InsertOrReplaceNode
                  ((KeyMapBase<unsigned_int> *)this,(KeyNode *)pPVar17);
        break;
      case 2:
        KeyMapBase<unsigned_long>::InsertOrReplaceNode
                  ((KeyMapBase<unsigned_long> *)this,(KeyNode *)pPVar17);
        break;
      default:
        goto switchD_004417a2_caseD_3;
      case 5:
        KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::InsertOrReplaceNode
                  ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this,(KeyNode *)pPVar17);
        break;
      case 6:
        LOCK();
        pcVar1 = pPVar28[-0x47f925].super_EpsCopyInputStream.patch_buffer_ + 8 + (long)pcVar21;
        uVar4 = *(undefined4 *)pcVar1;
        *(int *)pcVar1 = (int)ptr_00;
        ptr_00 = (ParseContext *)CONCAT44((int)((ulong)ptr_00 >> 0x20),uVar4);
        UNLOCK();
        cVar14 = -0x7c;
        if ((long)pcVar21 < 0) {
          cVar14 = (char)*(undefined4 *)((long)iVar27 + 0x28848b0c);
        }
        pcVar1 = (char *)((long)&UINT_006cb4e4 + (long)(int)uVar32 + 3);
        *pcVar1 = *pcVar1 + cVar14;
        pcVar21 = (char *)(ulong)(byte)((char)pcVar21 + 0x81);
        pPVar23 = pPVar17;
        goto code_r0x00443007;
      case 7:
        goto switchD_004417a2_caseD_7;
      case 8:
        *pcVar21 = *pcVar21 - (char)pcVar21;
        pPVar23 = pPVar17;
        goto code_r0x00443007;
      case 9:
      case 10:
        (*MapFieldBaseForParse::sync_map_with_repeated)(this,1);
        this = (ParseContext *)&(this->super_EpsCopyInputStream).next_chunk_;
        local_58 = (ZeroCopyInputStream *)(uVar30 & 0xffffffff | (ulong)bVar2 << 0x20);
        p = puVar19;
        goto LAB_00442e46;
      case 0xb:
        goto switchD_004417a2_caseD_b;
      case 0xc:
        if ((short)pcVar21 == 0) {
          pcVar21 = MpRepeatedVarintT<false,unsigned_long,(unsigned_short)0>
                              ((MessageLite *)msg_00,(char *)ptr_00,pPVar28,(TcFieldData)0x6cb484,
                               table_00,(uint64_t)hasbits_00);
          return pcVar21;
        }
        goto LAB_00443384;
      case 0xd:
        pcVar21 = MpRepeatedVarintT<false,bool,(unsigned_short)0>
                            ((MessageLite *)msg_00,(char *)ptr_00,pPVar28,(TcFieldData)0x6cb484,
                             table_00,(uint64_t)hasbits_00);
        return pcVar21;
      case 0xe:
        pcVar21 = (char *)(*(code *)(pcVar21 + in_R10))();
        return pcVar21;
      case 0xf:
        pcVar21 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)0>
                            ((MessageLite *)msg_00,(char *)ptr_00,pPVar28,(TcFieldData)0x6cb484,
                             table_00,(uint64_t)hasbits_00);
        return pcVar21;
      }
    }
    else {
      puVar20 = (uint *)UntypedMapBase::GetValue<int>((UntypedMapBase *)this,(NodeBase *)pPVar17);
      uVar32 = *puVar20;
      puVar20 = *(uint **)(local_80.data + 8);
      ptr_00 = (ParseContext *)(long)(short)*puVar20;
      msg_00 = (ParseContext *)(ulong)(*puVar20 >> 0x10);
      pPVar28 = (ParseContext *)(((long)(int)uVar32 - (long)ptr_00) - (long)msg_00);
      if ((ParseContext *)((long)(int)uVar32 - (long)ptr_00) < msg_00) goto LAB_0044177d;
      uVar15 = puVar20[1];
      ptr_00 = (ParseContext *)(ulong)uVar15;
      msg_00 = (ParseContext *)(ulong)(ushort)uVar15;
      if (msg_00 <= pPVar28) {
        pPVar28 = (ParseContext *)(ulong)(uVar15 >> 0x10);
        ptr_00 = (ParseContext *)0x0;
        do {
          if (pPVar28 <= ptr_00) goto LAB_00441834;
          uVar5 = *(uint *)((long)puVar20 + (long)ptr_00 * 4 + (ulong)(uVar15 >> 3 & 0x1ffc) + 8);
          msg_00 = (ParseContext *)(ulong)uVar5;
          table_00 = (TcParseTableBase *)(ulong)((int)uVar32 < (int)uVar5);
          ptr_00 = (ParseContext *)(((long)ptr_00 * 2 - (long)table_00) + 2);
        } while (uVar5 != uVar32);
        goto LAB_0044177d;
      }
      if ((puVar20[((ulong)pPVar28 >> 5) + 2] >> ((uint)pPVar28 & 0x1f) & 1) != 0)
      goto LAB_0044177d;
LAB_00441834:
      WriteMapEntryAsUnknown
                (msg,table,(UntypedMapBase *)this,uVar16,(NodeBase *)pPVar17,SUB85(local_58,0));
    }
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar19) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar20 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar20 & 3) != 0) {
          AlignFail();
        }
        *puVar20 = *puVar20 | (uint)hasbits;
      }
      return (char *)puVar19;
    }
    bVar3 = (byte)*puVar19;
    uVar32 = (uint)bVar3;
    ptr = (char *)((long)puVar19 + 1);
    if ((char)bVar3 < '\0') {
      uVar24 = (uint7)(((ulong)bVar3 << 0x39) >> 8);
      lVar31 = CONCAT71(uVar24,*ptr);
      if (*ptr < '\0') {
        uVar24 = uVar24 >> 7 | (uint7)((ulong)(lVar31 << 0x39) >> 8);
        lVar31 = CONCAT71(uVar24,(byte)puVar19[1]);
        if ((char)(byte)puVar19[1] < '\0') {
          uVar24 = uVar24 >> 7 | (uint7)((ulong)(lVar31 << 0x39) >> 8);
          lVar31 = CONCAT71(uVar24,*(byte *)((long)puVar19 + 3));
          if ((char)*(byte *)((long)puVar19 + 3) < '\0') {
            uVar24 = uVar24 >> 7 | (uint7)((ulong)(lVar31 << 0x39) >> 8);
            if ((char)(byte)puVar19[2] < '\0') {
              uVar32 = 0;
              ptr = (char *)0x0;
            }
            else {
              uVar32 = (int)CONCAT71(uVar24,(byte)puVar19[2]) << 0x1c | (uint)(uVar24 >> 0x1c);
              ptr = (char *)((long)puVar19 + 5);
            }
          }
          else {
            uVar32 = (int)lVar31 << 0x15 | (uint)(uVar24 >> 0x23);
            ptr = (char *)(puVar19 + 2);
          }
        }
        else {
          uVar32 = (int)lVar31 << 0xe | (uint)(uVar24 >> 0x2a);
          ptr = (char *)((long)puVar19 + 3);
        }
      }
      else {
        uVar32 = (int)lVar31 << 7 | (uint)(((ulong)bVar3 << 0x39) >> 0x39);
        ptr = (char *)(puVar19 + 1);
      }
    }
    if (uVar32 != uVar16) {
      uVar16 = (uint)table->fast_idx_mask & (uint)*puVar19;
      if ((uVar16 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar30 = (ulong)(uVar16 & 0xfffffff8);
      pcVar21 = (char *)(**(code **)(&table[1].has_bits_offset + uVar30))
                                  (msg,puVar19,ctx,
                                   (ulong)*puVar19 ^
                                   *(ulong *)(&table[1].fast_idx_mask + uVar30 * 2),table,hasbits);
      return pcVar21;
    }
  } while( true );
code_r0x00443007:
  uVar32 = (uint)pcVar21 & 0xf;
  puVar20 = &switchD_00443018::switchdataD_006cb49c;
  uVar30 = (ulong)(int)(&switchD_00443018::switchdataD_006cb49c)[uVar32];
  pcVar21 = (char *)((long)&switchD_00443018::switchdataD_006cb49c + uVar30);
  cVar14 = (char)pcVar21;
  switch(uVar32) {
  case 0:
switchD_00443018_caseD_0:
    msg_00 = this;
    lVar33 = in_ST0;
    lVar8 = in_ST1;
    lVar9 = in_ST2;
    lVar10 = in_ST3;
    lVar11 = in_ST4;
    lVar12 = in_ST5;
    lVar13 = in_ST6;
switchD_004417a2_caseD_b:
    in_ST6 = in_ST7;
    in_ST5 = lVar13;
    in_ST4 = lVar12;
    in_ST3 = lVar11;
    in_ST2 = lVar10;
    in_ST1 = lVar9;
    in_ST0 = lVar8;
    *(short *)((long)puVar20 * 5 + -0x12) = (short)lVar33;
    in_ST7 = in_ST6;
    KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)msg_00,(KeyNode *)pPVar23);
LAB_0044304c:
    do {
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar19) {
        if ((ulong)table->has_bits_offset != 0) {
          puVar20 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
          if (((ulong)puVar20 & 3) != 0) {
            AlignFail();
          }
          *puVar20 = *puVar20 | (uint)hasbits;
        }
        return (char *)puVar19;
      }
      bVar3 = (byte)*puVar19;
      uVar32 = (uint)bVar3;
      p = (ushort *)((long)puVar19 + 1);
      if ((char)bVar3 < '\0') {
        uVar24 = (uint7)(((ulong)bVar3 << 0x39) >> 8);
        lVar31 = CONCAT71(uVar24,*(byte *)p);
        if ((char)*(byte *)p < '\0') {
          uVar24 = uVar24 >> 7 | (uint7)((ulong)(lVar31 << 0x39) >> 8);
          lVar31 = CONCAT71(uVar24,(byte)puVar19[1]);
          if ((char)(byte)puVar19[1] < '\0') {
            uVar24 = uVar24 >> 7 | (uint7)((ulong)(lVar31 << 0x39) >> 8);
            lVar31 = CONCAT71(uVar24,*(byte *)((long)puVar19 + 3));
            if ((char)*(byte *)((long)puVar19 + 3) < '\0') {
              uVar24 = uVar24 >> 7 | (uint7)((ulong)(lVar31 << 0x39) >> 8);
              if ((char)(byte)puVar19[2] < '\0') {
                uVar32 = 0;
                p = (ushort *)0x0;
              }
              else {
                uVar32 = (int)CONCAT71(uVar24,(byte)puVar19[2]) << 0x1c | (uint)(uVar24 >> 0x1c);
                p = (ushort *)((long)puVar19 + 5);
              }
            }
            else {
              uVar32 = (int)lVar31 << 0x15 | (uint)(uVar24 >> 0x23);
              p = puVar19 + 2;
            }
          }
          else {
            uVar32 = (int)lVar31 << 0xe | (uint)(uVar24 >> 0x2a);
            p = (ushort *)((long)puVar19 + 3);
          }
        }
        else {
          uVar32 = (int)lVar31 << 7 | (uint)(((ulong)bVar3 << 0x39) >> 0x39);
          p = puVar19 + 1;
        }
      }
      if (uVar32 != uVar16) {
        uVar16 = (uint)table->fast_idx_mask & (uint)*puVar19;
        if ((uVar16 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        uVar30 = (ulong)(uVar16 & 0xfffffff8);
        pcVar21 = (char *)(**(code **)(&table[1].has_bits_offset + uVar30))
                                    (msg,puVar19,ctx,
                                     (ulong)*puVar19 ^
                                     *(ulong *)(&table[1].fast_idx_mask + uVar30 * 2),table,hasbits)
        ;
        return pcVar21;
      }
LAB_00442e46:
      pPVar28 = (ParseContext *)
                (ulong)*(ushort *)((long)&(this->super_EpsCopyInputStream).buffer_end_ + 4);
      pPVar23 = (ParseContext *)UntypedMapBase::AllocNode((UntypedMapBase *)this,(size_t)pPVar28);
      uVar18 = (ulong)*(ushort *)((long)&(this->super_EpsCopyInputStream).buffer_end_ + 4);
      uVar30 = uVar18 - 8;
      if (uVar30 < 8) {
        pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_long>
                            (uVar30,8,"node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)")
        ;
        pcVar21 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
        ;
        iVar27 = 0xb2c;
LAB_00443261:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_78,pcVar21,iVar27,pcVar22);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_78);
      }
      (pPVar23->super_EpsCopyInputStream).buffer_end_ = (char *)0x0;
      pcVar21 = (pPVar23->super_EpsCopyInputStream).patch_buffer_ + (uVar18 - 0x30);
      pcVar21[0] = '\0';
      pcVar21[1] = '\0';
      pcVar21[2] = '\0';
      pcVar21[3] = '\0';
      pcVar21[4] = '\0';
      pcVar21[5] = '\0';
      pcVar21[6] = '\0';
      pcVar21[7] = '\0';
      f_01.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
                *)&local_48;
      f_01.this = (UntypedMapBase *)this;
      f_01.node = (NodeBase **)&local_60;
      local_78 = this;
      _Stack_70._M_head_impl = (LogMessageData *)&local_48;
      local_68 = &local_60;
      local_60 = pPVar23;
      local_48 = this;
      UntypedMapBase::
      VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
                ((UntypedMapBase *)this,f_01);
      local_40 = &local_80;
      f_02.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                *)&local_48;
      f_02.this = (UntypedMapBase *)this;
      f_02.node = (NodeBase **)&local_60;
      local_78 = this;
      _Stack_70._M_head_impl = (LogMessageData *)&local_48;
      local_68 = &local_60;
      local_60 = pPVar23;
      local_48 = this;
      local_38 = this;
      UntypedMapBase::
      VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
                ((UntypedMapBase *)this,f_02);
      bVar3 = (byte)*p;
      aVar26.data._1_7_ = 0;
      aVar26.data._0_1_ = bVar3;
      if ((char)bVar3 < '\0') {
        pPVar28 = (ParseContext *)(ulong)(uint)bVar3;
        pVar35 = ReadSizeFallback((char *)p,(uint)bVar3);
        pPVar17 = pVar35._8_8_;
        if (pVar35.first == (char *)0x0) goto LAB_0044315e;
        aVar26.data = (ulong)pPVar17 & 0xffffffff;
      }
      else {
        pVar35._8_8_ = extraout_RDX_02;
        pVar35.first = (char *)((long)p + 1);
      }
      pPVar17 = pVar35._8_8_;
      ptr_00 = (ParseContext *)pVar35.first;
      if (ctx->depth_ < 1) {
LAB_0044315e:
        lVar6._0_4_ = (this->super_EpsCopyInputStream).size_;
        lVar6._4_4_ = (this->super_EpsCopyInputStream).limit_;
        if (lVar6 == 0) {
          UntypedMapBase::DeleteNode((UntypedMapBase *)this,(NodeBase *)pPVar23);
          pPVar17 = extraout_RDX_04;
          pPVar28 = pPVar23;
        }
        pcVar21 = Error(msg,(char *)pPVar28,pPVar17,(TcFieldData)aVar26,table,hasbits);
        return pcVar21;
      }
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)&local_78,(char *)ctx,(int)pVar35.first);
      EVar7.saved_errno_ = local_78._0_4_;
      lVar31 = (long)ctx->depth_ + -1;
      iVar29 = (int)lVar31;
      ctx->depth_ = iVar29;
      aVar26 = local_80;
      msg_00 = pPVar23;
      table_00 = table;
      hasbits_00 = local_50;
      pPVar36 = this;
      puVar19 = (ushort *)
                ParseOneMapEntry((NodeBase *)pPVar23,(char *)ptr_00,ctx,(FieldAux *)local_80,table,
                                 local_50,(UntypedMapBase *)this);
      iVar27 = ctx->depth_;
      if ((puVar19 != (ushort *)0x0) && (iVar29 != iVar27)) {
        pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar31,(long)iVar27,"old_depth == depth_");
        pcVar21 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
        ;
        iVar27 = 0x481;
        goto LAB_00443261;
      }
      ctx->depth_ = iVar27 + 1;
      uVar32 = EVar7.saved_errno_ + (ctx->super_EpsCopyInputStream).limit_;
      (ctx->super_EpsCopyInputStream).limit_ = uVar32;
      pPVar17 = extraout_RDX_03;
      pPVar28 = ptr_00;
      if (((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) ||
         ((ctx->super_EpsCopyInputStream).limit_end_ =
               (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar32 >> 0x1f & uVar32),
         puVar19 == (ushort *)0x0)) goto LAB_0044315e;
      pPVar28 = extraout_RDX_03;
      if ((bVar2 & 0x10) == 0) goto LAB_00442ff3;
      puVar20 = (uint *)UntypedMapBase::GetValue<int>((UntypedMapBase *)this,(NodeBase *)pPVar23);
      uVar32 = *puVar20;
      puVar20 = *(uint **)(local_80.data + 8);
      ptr_00 = (ParseContext *)(long)(short)*puVar20;
      msg_00 = (ParseContext *)(ulong)(*puVar20 >> 0x10);
      pPVar28 = (ParseContext *)(((long)(int)uVar32 - (long)ptr_00) - (long)msg_00);
      if ((ParseContext *)((long)(int)uVar32 - (long)ptr_00) < msg_00) goto LAB_00442ff3;
      uVar15 = puVar20[1];
      ptr_00 = (ParseContext *)(ulong)uVar15;
      msg_00 = (ParseContext *)(ulong)(ushort)uVar15;
      if (pPVar28 < msg_00) {
        if ((puVar20[((ulong)pPVar28 >> 5) + 2] >> ((uint)pPVar28 & 0x1f) & 1) != 0)
        goto LAB_00442ff3;
      }
      else {
        pPVar28 = (ParseContext *)(ulong)(uVar15 >> 0x10);
        ptr_00 = (ParseContext *)0x0;
        while (ptr_00 < pPVar28) {
          uVar5 = *(uint *)((long)puVar20 + (long)ptr_00 * 4 + (ulong)(uVar15 >> 3 & 0x1ffc) + 8);
          msg_00 = (ParseContext *)(ulong)uVar5;
          table_00 = (TcParseTableBase *)(ulong)((int)uVar32 < (int)uVar5);
          ptr_00 = (ParseContext *)(((long)ptr_00 * 2 - (long)table_00) + 2);
          if (uVar5 == uVar32) goto LAB_00442ff3;
        }
      }
      WriteMapEntryAsUnknown
                (msg,table,(UntypedMapBase *)this,uVar16,(NodeBase *)pPVar23,SUB85(local_58,0));
    } while( true );
  case 1:
switchD_00443018_caseD_1:
    KeyMapBase<unsigned_int>::InsertOrReplaceNode
              ((KeyMapBase<unsigned_int> *)this,(KeyNode *)pPVar23);
    goto LAB_0044304c;
  case 2:
switchD_00443018_caseD_2:
    msg_00 = this;
    lVar33 = in_ST0;
    lVar8 = in_ST1;
    lVar9 = in_ST2;
    lVar10 = in_ST3;
    lVar11 = in_ST4;
    lVar12 = in_ST5;
    lVar13 = in_ST6;
switchD_004417a2_caseD_7:
    in_ST6 = in_ST7;
    in_ST5 = lVar13;
    in_ST4 = lVar12;
    in_ST3 = lVar11;
    in_ST2 = lVar10;
    in_ST1 = lVar9;
    in_ST0 = lVar8;
    *(short *)((long)puVar20 * 5 + -0x12) = (short)lVar33;
    in_ST7 = in_ST6;
    KeyMapBase<unsigned_long>::InsertOrReplaceNode
              ((KeyMapBase<unsigned_long> *)msg_00,(KeyNode *)pPVar23);
    goto LAB_0044304c;
  case 5:
switchD_00443018_caseD_5:
    KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertOrReplaceNode((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this,(KeyNode *)pPVar23);
    goto LAB_0044304c;
  case 6:
switchD_00443018_caseD_6:
    switch(uVar32) {
    case 0:
      goto switchD_00443018_caseD_0;
    case 1:
      goto switchD_00443018_caseD_1;
    case 2:
      goto switchD_00443018_caseD_2;
    default:
      break;
    case 5:
      goto switchD_00443018_caseD_5;
    case 6:
      goto switchD_00443018_caseD_6;
    case 7:
      goto switchD_00443018_caseD_7;
    case 8:
      goto switchD_00443018_caseD_8;
    case 9:
      goto switchD_00443018_caseD_9;
    case 10:
      goto switchD_00443018_caseD_a;
    case 0xb:
      goto switchD_00443018_caseD_b;
    case 0xc:
      goto switchD_00443018_caseD_c;
    case 0xd:
    case 0xe:
      goto switchD_00443018_caseD_d;
    case 0xf:
      goto switchD_00443018_caseD_f;
    }
  case 7:
switchD_00443018_caseD_7:
    pcVar21 = (char *)((long)&UINT_006cb41c + uVar30 + 3);
    *pcVar21 = *pcVar21 + -100;
    halt_baddata();
  case 8:
switchD_00443018_caseD_8:
    pcVar1 = msg_00[0xf877].super_EpsCopyInputStream.patch_buffer_ + 0x1b;
    *pcVar1 = *pcVar1 + cVar14;
    UINT_006cb41c._1_1_ = 0x86;
    *(char *)&(pPVar28->super_EpsCopyInputStream).limit_end_ =
         *(char *)&(pPVar28->super_EpsCopyInputStream).limit_end_ + cVar14;
switchD_00443018_caseD_9:
    *pcVar21 = *pcVar21 + cVar14;
LAB_00443384:
    if (((uint)pcVar21 & 0xffff) != 0x200) {
      pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((long)pcVar21,0x200,"xform_val == +field_layout::kTvZigZag");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&stack0xffffffffffffff38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x87a,pcVar22);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&stack0xffffffffffffff38);
    }
    pcVar21 = MpRepeatedVarintT<false,unsigned_long,(unsigned_short)512>
                        ((MessageLite *)msg_00,(char *)ptr_00,pPVar28,(TcFieldData)puVar20,table_00,
                         (uint64_t)hasbits_00);
    return pcVar21;
  case 9:
    goto switchD_00443018_caseD_9;
  case 10:
switchD_00443018_caseD_a:
    do {
    } while( true );
  case 0xb:
switchD_00443018_caseD_b:
    pcVar21 = (char *)(ulong)(*(byte *)((long)&(msg_00->super_EpsCopyInputStream).buffer_end_ + 7) &
                             0xf);
  case 0xf:
switchD_00443018_caseD_f:
    if (5 < (uint)pcVar21) {
      UntypedMapBase::
      VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
                ();
    }
    puVar20 = &switchD_00446dcc::switchdataD_006cb4c4;
code_r0x00446dc5:
    pcVar21 = (char *)(*(code *)((long)(int)puVar20[(long)pcVar21] + (long)puVar20))();
    return pcVar21;
  case 0xc:
switchD_00443018_caseD_c:
    if (SCARRY8(uVar30,0x6cb49c) != (long)pcVar21 < 0) {
      return (char *)pPVar36;
    }
    pcVar1 = (char *)((long)&UINT_006cb428 + uVar30 + 1);
    *pcVar1 = *pcVar1 + -100 + (0xffffffffff934b63 < uVar30);
    pcVar21 = (char *)(ulong)((uint)pcVar21 | 0x2846ff);
    goto code_r0x00446dc5;
  case 0xd:
  case 0xe:
switchD_00443018_caseD_d:
    *pcVar21 = *pcVar21 - (char)table_00;
    goto code_r0x00446dc5;
  }
  goto switchD_00443018_caseD_3;
LAB_00442ff3:
  uVar32 = *(uint *)((long)&(this->super_EpsCopyInputStream).buffer_end_ + 4);
  pcVar21 = (char *)(ulong)(uVar32 >> 0x18);
  if (5 < ((byte)(uVar32 >> 0x18) & 0xf)) {
switchD_00443018_caseD_3:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                ,0xb68);
  }
  goto code_r0x00443007;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpMap(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  // `aux[0]` points into a MapAuxInfo.
  // If we have a message mapped_type aux[1] points into a `create_in_arena`.
  // If we have a validated enum mapped_type aux[1] point into a
  // `enum_data`.
  const auto* aux = table->field_aux(&entry);
  const auto map_info = aux[0].map_info;

  if (ABSL_PREDICT_FALSE(!map_info.is_supported ||
                         (data.tag() & 7) !=
                             WireFormatLite::WIRETYPE_LENGTH_DELIMITED)) {
    PROTOBUF_MUSTTAIL return MpFallback(PROTOBUF_TC_PARAM_PASS);
  }

  // When using LITE, the offset points directly into the Map<> object.
  // Otherwise, it points into a MapField and we must synchronize with
  // reflection. It is done by calling the MutableMap() virtual function on the
  // field's base class.
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  UntypedMapBase& map =
      map_info.use_lite
          ? RefAt<UntypedMapBase>(base, entry.offset)
          : *RefAt<MapFieldBaseForParse>(base, entry.offset).MutableMap();

  const uint32_t saved_tag = data.tag();

  while (true) {
    NodeBase* node = map.AllocNode();
    char* const node_end =
        reinterpret_cast<char*>(node) + map.type_info().node_size;
    void* const node_key = node->GetVoidKey();

    // Due to node alignment we can guarantee that we have at least 8 writable
    // bytes from the key position to the end of the node.
    // We can initialize the first and last 8 bytes, which takes care of all the
    // scalar value types. This makes the VisitXXX calls below faster because
    // the switch is much smaller.
    // Assert this in debug mode, just in case.
    ABSL_DCHECK_GE(node_end - static_cast<char*>(node_key), sizeof(uint64_t));
    memset(node_key, 0, sizeof(uint64_t));
    memset(node_end - sizeof(uint64_t), 0, sizeof(uint64_t));

    map.VisitKey(  //
        node, absl::Overload{
                  [&](std::string* str) {
                    Arena::CreateInArenaStorage(str, map.arena());
                  },
                  // Already initialized above. Do nothing here.
                  [](void*) {},
              });

    map.VisitValue(  //
        node, absl::Overload{
                  [&](std::string* str) {
                    Arena::CreateInArenaStorage(str, map.arena());
                  },
                  [&](MessageLite* msg) {
                    aux[1].table->class_data->PlacementNew(msg, map.arena());
                  },
                  // Already initialized above. Do nothing here.
                  [](void*) {},
              });

    ptr = ctx->ParseLengthDelimitedInlined(ptr, [&](const char* ptr) {
      return ParseOneMapEntry(node, ptr, ctx, aux, table, entry, map);
    });

    if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
      // Parsing failed. Delete the node that we didn't insert.
      if (map.arena() == nullptr) map.DeleteNode(node);
      PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    if (ABSL_PREDICT_FALSE(
            map_info.value_is_validated_enum &&
            !internal::ValidateEnumInlined(*map.GetValue<int32_t>(node),
                                           aux[1].enum_data))) {
      WriteMapEntryAsUnknown(msg, table, map, saved_tag, node, map_info);
    } else {
      // Done parsing the node, insert it.
      switch (map.type_info().key_type_kind()) {
        case UntypedMapBase::TypeKind::kBool:
          static_cast<KeyMapBase<bool>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<bool>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kU32:
          static_cast<KeyMapBase<uint32_t>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<uint32_t>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kU64:
          static_cast<KeyMapBase<uint64_t>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<uint64_t>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kString:
          static_cast<KeyMapBase<std::string>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<std::string>::KeyNode*>(node));
          break;
        default:
          Unreachable();
      }
    }

    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) {
      PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    uint32_t next_tag;
    const char* ptr2 = ReadTagInlined(ptr, &next_tag);
    if (next_tag != saved_tag) break;
    ptr = ptr2;
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}